

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msd_lsd.cpp
# Opt level: O1

void msd_lsd_adaptive<12u>(Cacheblock<12U> *cache,size_t N,size_t depth)

{
  undefined8 *puVar1;
  bool bVar2;
  undefined8 uVar3;
  uchar *puVar4;
  void *__src;
  long lVar5;
  Cacheblock<12U> *pCVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  size_t sVar10;
  ushort uVar11;
  ulong uVar12;
  uchar *puVar13;
  long alStack_80038 [65537];
  
  while( true ) {
    if (N < 0x10000) {
      msd_lsd<12u>(cache,N,depth);
      return;
    }
    fill_cache<12u>(cache,N,depth);
    puVar13 = (cache->chars)._M_elems + 0xb;
    uVar8 = 0xb;
    do {
      memset(alStack_80038,0,0x80000);
      puVar4 = puVar13;
      uVar9 = N;
      do {
        alStack_80038[(ushort)(*(ushort *)(puVar4 + -1) << 8 | *(ushort *)(puVar4 + -1) >> 8)] =
             alStack_80038[(ushort)(*(ushort *)(puVar4 + -1) << 8 | *(ushort *)(puVar4 + -1) >> 8)]
             + 1;
        puVar4 = puVar4 + 0x18;
        uVar9 = uVar9 - 1;
      } while (uVar9 != 0);
      __src = malloc(N * 0x18);
      msd_lsd_adaptive<12U>::bucketindex[0] = 0;
      lVar5 = 0;
      sVar10 = 0;
      do {
        sVar10 = sVar10 + alStack_80038[lVar5];
        msd_lsd_adaptive<12U>::bucketindex[lVar5 + 1] = sVar10;
        lVar5 = lVar5 + 1;
        pCVar6 = cache;
        uVar9 = N;
      } while (lVar5 != 0xffff);
      do {
        uVar11 = *(ushort *)((pCVar6->chars)._M_elems + (uVar8 - 1));
        uVar11 = uVar11 << 8 | uVar11 >> 8;
        sVar10 = msd_lsd_adaptive<12U>::bucketindex[uVar11];
        msd_lsd_adaptive<12U>::bucketindex[uVar11] = sVar10 + 1;
        *(uchar **)((long)__src + sVar10 * 0x18 + 0x10) = pCVar6->ptr;
        uVar3 = *(undefined8 *)((pCVar6->chars)._M_elems + 8);
        puVar1 = (undefined8 *)((long)__src + sVar10 * 0x18);
        *puVar1 = *(undefined8 *)(pCVar6->chars)._M_elems;
        puVar1[1] = uVar3;
        uVar9 = uVar9 - 1;
        pCVar6 = pCVar6 + 1;
      } while (uVar9 != 0);
      memcpy(cache,__src,N * 0x18);
      free(__src);
      puVar13 = puVar13 + -2;
      bVar2 = 2 < uVar8;
      uVar8 = uVar8 - 2;
    } while (bVar2);
    if (N == 1) {
      uVar9 = 1;
      uVar8 = 0;
    }
    else {
      uVar12 = 1;
      uVar7 = 0;
      sVar10 = 1;
      pCVar6 = cache;
      do {
        if (*(int *)((pCVar6->chars)._M_elems + 8) == *(int *)(pCVar6[1].chars._M_elems + 8) &&
            *(long *)(pCVar6->chars)._M_elems == *(long *)pCVar6[1].chars._M_elems) {
          uVar9 = sVar10 + 1;
          uVar8 = uVar7;
        }
        else {
          uVar9 = 1;
          uVar8 = uVar12;
          if ((1 < sVar10) && (cache[uVar7].chars._M_elems[0xb] != '\0')) {
            msd_lsd_adaptive<12u>(cache + uVar7,sVar10,depth + 0xc);
          }
        }
        uVar12 = uVar12 + 1;
        pCVar6 = pCVar6 + 1;
        uVar7 = uVar8;
        sVar10 = uVar9;
      } while (N != uVar12);
    }
    if ((uVar9 < 2) || (cache[uVar8].chars._M_elems[0xb] == '\0')) break;
    cache = cache + uVar8;
    depth = depth + 0xc;
    N = uVar9;
  }
  return;
}

Assistant:

static void
msd_lsd_adaptive(Cacheblock<CachedChars>* cache, size_t N, size_t depth)
{
	static_assert(CachedChars%2==0, "CachedChars%2==0");
	static_assert(CachedChars>=2,   "CachedChars>=2");
	if (N < 0x10000) {
		msd_lsd(cache, N, depth);
		return;
	}
	fill_cache(cache, N, depth);
	for (int byte=CachedChars-1; byte > 0; byte -= 2) {
		size_t bucketsize[0x10000] = {0};
		for (size_t i=0; i < N; ++i) {
			uint16_t bucket =
				(cache[i].chars[byte-1] << 8) | cache[i].chars[byte];
			++bucketsize[bucket];
		}
		Cacheblock<CachedChars>* sorted = (Cacheblock<CachedChars>*)
			malloc(N*sizeof(Cacheblock<CachedChars>));
		static size_t bucketindex[0x10000];
		bucketindex[0] = 0;
		for (size_t i=1; i < 0x10000; ++i)
			bucketindex[i] = bucketindex[i-1] + bucketsize[i-1];
		for (size_t i=0; i < N; ++i) {
			uint16_t bucket =
				(cache[i].chars[byte-1] << 8) | cache[i].chars[byte];
			memcpy(&sorted[bucketindex[bucket]++],
					cache+i,
					sizeof(Cacheblock<CachedChars>));
		}
		memcpy(cache, sorted, N*sizeof(Cacheblock<CachedChars>));
		free(sorted);
	}
	size_t start=0, cnt=1;
	for (size_t i=0; i < N-1; ++i) {
		if (memcmp(cache[i].chars.data(), cache[i+1].chars.data(),
				CachedChars) == 0) {
			++cnt;
			continue;
		}
		if (cnt > 1 && cache[start].chars[CachedChars-1] != 0) {
			msd_lsd_adaptive(cache+start, cnt, depth+CachedChars);
		}
		cnt = 1;
		start = i+1;
	}
	if (cnt > 1 && cache[start].chars[CachedChars-1] != 0) {
		msd_lsd_adaptive(cache+start, cnt, depth+CachedChars);
	}
}